

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O3

Matrix6x6 * __thiscall
iDynTree::ArticulatedBodyInertia::getInverse
          (Matrix6x6 *__return_storage_ptr__,ArticulatedBodyInertia *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  Matrix<double,_6,_6,_0,_6,_6> abi;
  assign_op<double,_double> local_141;
  SrcXprType local_140;
  Matrix<double,_6,_6,_0,_6,_6> local_138;
  Matrix6x6 *local_18 [2];
  
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (this->linearLinear).m_data[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       (this->linearLinear).m_data[3];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
       (this->linearLinear).m_data[6];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       (this->linearLinear).m_data[1];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
       (this->linearLinear).m_data[4];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
       (this->linearLinear).m_data[7];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc]
       = (this->linearLinear).m_data[2];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd]
       = (this->linearLinear).m_data[5];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe]
       = (this->linearLinear).m_data[8];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x12] = (this->linearAngular).m_data[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x13] = (this->linearAngular).m_data[3];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x14] = (this->linearAngular).m_data[6];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x18] = (this->linearAngular).m_data[1];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x19] = (this->linearAngular).m_data[4];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1a] = (this->linearAngular).m_data[7];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1e] = (this->linearAngular).m_data[2];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1f] = (this->linearAngular).m_data[5];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x20] = (this->linearAngular).m_data[8];
  lVar3 = 0xc;
  do {
    puVar1 = (undefined8 *)((long)(this->linearLinear).m_data + lVar3 + 0x3c);
    uVar2 = puVar1[1];
    *(undefined8 *)
     ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + lVar3 * 2) = *puVar1;
    *(undefined8 *)
     ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + lVar3 * 2 + 8) = uVar2;
    *(undefined8 *)
     ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + lVar3 * 2 + 0x10) =
         *(undefined8 *)((long)(this->linearAngular).m_data + lVar3 + 4);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x54);
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x15] = (this->angularAngular).m_data[0];
  local_140.m_xpr = &local_138;
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x16] = (this->angularAngular).m_data[3];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x17] = (this->angularAngular).m_data[6];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1b] = (this->angularAngular).m_data[1];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1c] = (this->angularAngular).m_data[4];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1d] = (this->angularAngular).m_data[7];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x21] = (this->angularAngular).m_data[2];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x22] = (this->angularAngular).m_data[5];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x23] = (this->angularAngular).m_data[8];
  local_18[0] = __return_storage_ptr__;
  Eigen::internal::
  Assignment<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Inverse<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_18,&local_140,
        &local_141);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 ArticulatedBodyInertia::getInverse() const
{
    Matrix6x6 ret;

    Eigen::Matrix<double,6,6> abi;

    abi.block<3,3>(0,0) = toEigen(linearLinear);
    abi.block<3,3>(0,3) = toEigen(linearAngular);
    abi.block<3,3>(3,0) = toEigen(linearAngular).transpose();
    abi.block<3,3>(3,3) = toEigen(angularAngular);

    toEigen(ret) = abi.inverse();

    return ret;
}